

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patternprops.cpp
# Opt level: O1

UChar * icu_63::PatternProps::trimWhiteSpace(UChar *s,int32_t *length)

{
  UChar UVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  UChar *pUVar5;
  bool bVar6;
  
  uVar2 = *length;
  if ((int)uVar2 < 1) {
    return s;
  }
  UVar1 = *s;
  if ((ushort)UVar1 < 0x100) {
    bVar6 = (bool)((byte)latin1[(ushort)UVar1] >> 2 & 1);
  }
  else if ((ushort)UVar1 - 0x200e < 0x1c) {
    bVar6 = (ushort)UVar1 - 0x2028 < 0xffffffe8;
  }
  else {
    bVar6 = false;
  }
  if (bVar6 == false) {
    UVar1 = s[(ulong)uVar2 - 1];
    if ((ushort)UVar1 < 0x100) {
      bVar6 = (bool)((byte)latin1[(ushort)UVar1] >> 2 & 1);
    }
    else if ((ushort)UVar1 - 0x200e < 0x1c) {
      bVar6 = (ushort)UVar1 - 0x2028 < 0xffffffe8;
    }
    else {
      bVar6 = false;
    }
    if (bVar6 == false) {
      return s;
    }
  }
  uVar4 = 1;
  if (1 < (int)uVar2) {
    uVar4 = (ulong)uVar2;
  }
  uVar3 = 0;
  while( true ) {
    UVar1 = s[uVar3];
    if ((ushort)UVar1 < 0x100) {
      bVar6 = (bool)((byte)latin1[(ushort)UVar1] >> 2 & 1);
    }
    else if ((ushort)UVar1 - 0x200e < 0x1c) {
      bVar6 = (ushort)UVar1 - 0x2028 < 0xffffffe8;
    }
    else {
      bVar6 = false;
    }
    if (bVar6 == false) break;
    uVar3 = uVar3 + 1;
    if (uVar4 == uVar3) goto LAB_001abccb;
  }
  pUVar5 = s + uVar2;
  uVar2 = uVar2 + 1;
  do {
    pUVar5 = pUVar5 + -1;
    UVar1 = *pUVar5;
    if ((ushort)UVar1 < 0x100) {
      bVar6 = (bool)((byte)latin1[(ushort)UVar1] >> 2 & 1);
    }
    else if ((ushort)UVar1 - 0x200e < 0x1c) {
      bVar6 = (ushort)UVar1 - 0x2028 < 0xffffffe8;
    }
    else {
      bVar6 = false;
    }
    uVar2 = uVar2 - 1;
  } while (bVar6 != false);
  uVar4 = uVar3 & 0xffffffff;
LAB_001abccb:
  *length = uVar2 - (int)uVar4;
  return s + uVar4;
}

Assistant:

const UChar *
PatternProps::trimWhiteSpace(const UChar *s, int32_t &length) {
    if(length<=0 || (!isWhiteSpace(s[0]) && !isWhiteSpace(s[length-1]))) {
        return s;
    }
    int32_t start=0;
    int32_t limit=length;
    while(start<limit && isWhiteSpace(s[start])) {
        ++start;
    }
    if(start<limit) {
        // There is non-white space at start; we will not move limit below that,
        // so we need not test start<limit in the loop.
        while(isWhiteSpace(s[limit-1])) {
            --limit;
        }
    }
    length=limit-start;
    return s+start;
}